

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibrary.cpp
# Opt level: O0

string * __thiscall
deqp::sl::ShaderParser::parseShaderSource_abi_cxx11_
          (string *__return_storage_ptr__,ShaderParser *this,char *str)

{
  char cVar1;
  deBool dVar2;
  bool bVar3;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream o;
  char *p;
  char *str_local;
  ShaderParser *this_local;
  
  o._368_8_ = str + 2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  for (; *(char *)o._368_8_ == ' '; o._368_8_ = o._368_8_ + 1) {
  }
  while (dVar2 = isEOL(*(char *)o._368_8_), dVar2 != 0) {
    o._368_8_ = o._368_8_ + 1;
  }
  while( true ) {
    bVar3 = true;
    if (*(char *)o._368_8_ == '\"') {
      bVar3 = *(char *)(o._368_8_ + 1) != '\"';
    }
    if (!bVar3) break;
    if (*(char *)o._368_8_ == '\\') {
      cVar1 = *(char *)(o._368_8_ + 1);
      if (cVar1 != '\0') {
        if (cVar1 == 'n') {
          std::operator<<((ostream *)local_1a0,'\n');
        }
        else if (cVar1 == 't') {
          std::operator<<((ostream *)local_1a0,'\t');
        }
        else {
          std::operator<<((ostream *)local_1a0,*(char *)(o._368_8_ + 1));
        }
      }
      o._368_8_ = o._368_8_ + 2;
    }
    else {
      cVar1 = *(char *)o._368_8_;
      o._368_8_ = o._368_8_ + 1;
      std::operator<<((ostream *)local_1a0,cVar1);
    }
  }
  std::__cxx11::ostringstream::str();
  removeExtraIndentation(__return_storage_ptr__,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string ShaderParser::parseShaderSource(const char* str)
{
	const char*   p = str + 2;
	ostringstream o;

	// Eat first empty line from beginning.
	while (*p == ' ')
		p++;
	while (isEOL(*p))
		p++;

	while ((p[0] != '"') || (p[1] != '"'))
	{
		if (*p == '\\')
		{
			switch (p[1])
			{
			case 0:
				DE_ASSERT(DE_FALSE);
				break;
			case 'n':
				o << '\n';
				break;
			case 't':
				o << '\t';
				break;
			default:
				o << p[1];
				break;
			}

			p += 2;
		}
		else
			o << *p++;
	}

	return removeExtraIndentation(o.str());
}